

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O1

string * tinyusdz::unwrap(string *__return_storage_ptr__,string *str,string *delim)

{
  ulong uVar1;
  ulong uVar2;
  pointer pcVar3;
  int iVar4;
  size_type sVar5;
  bool bVar6;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  uVar1 = delim->_M_string_length;
  uVar2 = str->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + uVar2);
  if (uVar1 <= uVar2) {
    bVar6 = false;
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)__return_storage_ptr__);
    if (local_48 == delim->_M_string_length) {
      if (local_48 == 0) {
        bVar6 = true;
      }
      else {
        iVar4 = bcmp(local_50,(delim->_M_dataplus)._M_p,local_48);
        bVar6 = iVar4 == 0;
      }
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (bVar6) {
      ::std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
    }
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)__return_storage_ptr__);
    if (local_48 == delim->_M_string_length) {
      if (local_48 == 0) {
        bVar6 = true;
      }
      else {
        iVar4 = bcmp(local_50,(delim->_M_dataplus)._M_p,local_48);
        bVar6 = iVar4 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (bVar6) {
      sVar5 = __return_storage_ptr__->_M_string_length - uVar1;
      if (__return_storage_ptr__->_M_string_length < uVar1) {
        ::std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
      }
      __return_storage_ptr__->_M_string_length = sVar5;
      (__return_storage_ptr__->_M_dataplus)._M_p[sVar5] = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string unwrap(const std::string &str,
                          const std::string &delim = "\"") {
  size_t n = delim.size();

  if (str.size() < n) {
    return str;
  }

  std::string s = str;

  if (s.substr(0, n) == delim) {
    s.erase(0, n);
  }

  if (s.substr(s.size() - n) == delim) {
    s.erase(s.size() - n);
  }

  return s;
}